

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O2

void end_macro(void)

{
  int *piVar1;
  TokenString *str;
  
  str = macro_stack;
  macro_ptr = macro_stack->prev_ptr;
  piVar1 = &macro_stack->save_line_num;
  macro_stack = macro_stack->prev;
  file->line_num = *piVar1;
  if (str->alloc == '\x02') {
    str->alloc = '\x03';
    return;
  }
  tok_str_free(str);
  return;
}

Assistant:

ST_FUNC void end_macro(void) {
  TokenString* str = macro_stack;
  macro_stack = str->prev;
  macro_ptr = str->prev_ptr;
  file->line_num = str->save_line_num;
  if (str->alloc == 2) {
    str->alloc = 3; /* just mark as finished */
  } else {
    tok_str_free(str);
  }
}